

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsHeaderSFXChannel(uint arg_count,long *arg_array)

{
  long lVar1;
  long lVar2;
  uchar local_30;
  long *arg_array_local;
  uint arg_count_local;
  
  if (3 < arg_count) {
    if ((target_driver < 3) ||
       (lVar2 = *arg_array, lVar1 = LookupDictionary("cNoise"), lVar2 != lVar1)) {
      if ((target_driver < 3) &&
         (lVar2 = *arg_array, lVar1 = LookupDictionary("cFM6"), lVar2 == lVar1)) {
        PrintError(
                  "Error: Using channel ID of FM6 ($06) in Sonic 1 or Sonic 2 drivers is unsupported. Change it to another channel.\n"
                  );
      }
    }
    else {
      PrintError(
                "Error: Using channel ID of cNoise ($E0) in Sonic 3 driver is dangerous. Fix the song so that it turns into a noise channel instead.\n"
                );
    }
    WriteByte(0x80);
    WriteByte((uchar)*arg_array);
    CheckedChannelPointer((uint)arg_array[1]);
    if ((*arg_array & 0x80U) == 0) {
      local_30 = (uchar)arg_array[2];
    }
    else {
      lVar2 = PSGPitchConvert(arg_array[2]);
      local_30 = (uchar)lVar2;
    }
    WriteByte(local_30);
    WriteByte((uchar)arg_array[3]);
    return;
  }
  __assert_fail("arg_count >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x1eb,"void Macro_smpsHeaderSFXChannel(unsigned int, long *)");
}

Assistant:

static void Macro_smpsHeaderSFXChannel(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	if (target_driver >= 3 && arg_array[0] == LookupDictionary("cNoise"))
		PrintError("Error: Using channel ID of cNoise ($E0) in Sonic 3 driver is dangerous. Fix the song so that it turns into a noise channel instead.\n");
	else if (target_driver < 3 && arg_array[0] == LookupDictionary("cFM6"))
		PrintError("Error: Using channel ID of FM6 ($06) in Sonic 1 or Sonic 2 drivers is unsupported. Change it to another channel.\n");

	WriteByte(0x80);			// Playback-control
	WriteByte(arg_array[0]);		// Channel ID
	CheckedChannelPointer(arg_array[1]);	// Location
	WriteByte((arg_array[0] & 0x80) ? PSGPitchConvert(arg_array[2]) : arg_array[2]);	// Pitch
	WriteByte(arg_array[3]);		// Volume
}